

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O2

LLVMPointerAnalysisOptions *
dg::DGLLVMPointerAnalysis::createOptions
          (LLVMPointerAnalysisOptions *__return_storage_ptr__,char *entry_func,
          uint64_t field_sensitivity,bool threads)

{
  allocator local_41;
  string local_40 [32];
  
  LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions(__return_storage_ptr__);
  __return_storage_ptr__->threads = threads;
  (__return_storage_ptr__->super_PointerAnalysisOptions).super_AnalysisOptions.fieldSensitivity.
  offset = field_sensitivity;
  std::__cxx11::string::string(local_40,entry_func,&local_41);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

static LLVMPointerAnalysisOptions createOptions(const char *entry_func,
                                                    uint64_t field_sensitivity,
                                                    bool threads = false) {
        LLVMPointerAnalysisOptions opts;
        opts.threads = threads;
        opts.setFieldSensitivity(field_sensitivity);
        opts.setEntryFunction(entry_func);
        return opts;
    }